

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorTables::FieldsByCamelcaseNamesLazyInitInternal
          (FileDescriptorTables *this)

{
  _Hash_node_base *p_Var1;
  long lVar2;
  _Hash_node_base *p_Var3;
  PointerStringPair camelcase_key;
  first_type local_28;
  
  p_Var3 = (this->fields_by_number_)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      p_Var1 = p_Var3[3]._M_nxt;
      lVar2 = 0x50;
      if (*(char *)((long)&p_Var1[8]._M_nxt + 2) == '\x01') {
        local_28.first = p_Var1[0xc]._M_nxt;
        if ((_Hash_node_base *)local_28.first == (_Hash_node_base *)0x0) {
          lVar2 = 0x28;
          goto LAB_002cf2e4;
        }
      }
      else {
LAB_002cf2e4:
        local_28.first = *(void **)((long)&p_Var1->_M_nxt + lVar2);
      }
      local_28.second = (char *)(p_Var1[3]._M_nxt)->_M_nxt;
      InsertIfNotPresent<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
                (&this->fields_by_camelcase_name_,&local_28,(second_type *)(p_Var3 + 3));
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void FileDescriptorTables::FieldsByCamelcaseNamesLazyInitInternal() const {
  for (FieldsByNumberMap::const_iterator it = fields_by_number_.begin();
       it != fields_by_number_.end(); it++) {
    PointerStringPair camelcase_key(FindParentForFieldsByMap(it->second),
                                    it->second->camelcase_name().c_str());
    InsertIfNotPresent(&fields_by_camelcase_name_, camelcase_key,
                            it->second);
  }
}